

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O3

Vec_Wrd_t * Abc_SuppGenPairs(Vec_Wrd_t *p,int nBits)

{
  ulong *puVar1;
  ulong *puVar2;
  uint uVar3;
  Vec_Wrd_t *p_00;
  word *pwVar4;
  void *__ptr;
  long lVar5;
  char cVar6;
  ulong Entry;
  ulong *puVar7;
  ulong *puVar8;
  
  p_00 = (Vec_Wrd_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  pwVar4 = (word *)malloc(8000);
  cVar6 = '\x05';
  if (5 < nBits) {
    cVar6 = (char)nBits;
  }
  p_00->pArray = pwVar4;
  __ptr = calloc((long)(1 << (cVar6 - 5U & 0x1f)),4);
  if ((long)p->nSize < 1) {
LAB_0049b658:
    if (__ptr == (void *)0x0) {
      return p_00;
    }
  }
  else {
    puVar1 = p->pArray + p->nSize;
    puVar8 = p->pArray;
    do {
      puVar2 = puVar8 + 1;
      puVar7 = puVar2;
      if (puVar1 <= puVar2) goto LAB_0049b658;
      do {
        Entry = *puVar7 ^ *puVar8;
        lVar5 = (long)((int)(uint)Entry >> 5);
        uVar3 = *(uint *)((long)__ptr + lVar5 * 4);
        if ((uVar3 >> ((uint)Entry & 0x1f) & 1) == 0) {
          *(uint *)((long)__ptr + lVar5 * 4) = 1 << ((byte)Entry & 0x1f) ^ uVar3;
          Vec_WrdPush(p_00,Entry);
        }
        puVar7 = puVar7 + 1;
      } while (puVar7 < puVar1);
      puVar8 = puVar2;
    } while (puVar2 < puVar1);
  }
  free(__ptr);
  return p_00;
}

Assistant:

Vec_Wrd_t * Abc_SuppGenPairs( Vec_Wrd_t * p, int nBits )
{
    Vec_Wrd_t * vRes = Vec_WrdAlloc( 1000 );
    unsigned * pMap = ABC_CALLOC( unsigned, 1 << Abc_MaxInt(0,nBits-5) ); 
    word * pLimit = Vec_WrdLimit(p);
    word * pEntry1 = Vec_WrdArray(p);
    word * pEntry2, Value;
    for ( ; pEntry1 < pLimit; pEntry1++ )
    for ( pEntry2 = pEntry1 + 1; pEntry2 < pLimit; pEntry2++ )
    {
        Value = *pEntry1 ^ *pEntry2;
        if ( Abc_InfoHasBit(pMap, (int)Value) )
            continue;
        Abc_InfoXorBit( pMap, (int)Value );
        Vec_WrdPush( vRes, Value );
    }
    ABC_FREE( pMap );
    return vRes;
}